

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

vector<nonius::parameters,_std::allocator<nonius::parameters>_> *
nonius::generate_params(param_configuration *cfg)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>
  __l;
  initializer_list<nonius::parameters> __l_00;
  anon_class_40_5_c0cd6f44 __gen;
  bool bVar1;
  param_registry *this;
  run_configuration *prVar2;
  mapped_type *pmVar3;
  back_insert_iterator<std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>_>
  __first;
  long in_RSI;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> *in_RDI;
  param next;
  mapped_type oper;
  param step;
  run_configuration *run;
  parameters params;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> *r;
  parameters *in_stack_fffffffffffffca8;
  key_type *__k;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>
  *in_stack_fffffffffffffcb0;
  function<nonius::param_(nonius::param,_nonius::param)> *in_stack_fffffffffffffcb8;
  function<nonius::param_(nonius::param,_nonius::param)> *in_stack_fffffffffffffcc0;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> *this_00;
  size_type in_stack_fffffffffffffcc8;
  multiplies<nonius::param> *in_stack_fffffffffffffcd0;
  iterator in_stack_fffffffffffffcd8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>
  *in_stack_fffffffffffffce0;
  iterator in_stack_fffffffffffffce8;
  allocator_type *in_stack_fffffffffffffcf0;
  unsigned_long in_stack_fffffffffffffd00;
  undefined1 ****ppppuVar4;
  key_type *pkVar5;
  run_configuration *in_stack_fffffffffffffd40;
  undefined8 ***local_288;
  unsigned_long local_218;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> *local_210;
  byte local_1f6;
  undefined1 local_1f5 [13];
  undefined8 **local_1e8 [8];
  undefined1 local_1a8 [64];
  undefined1 ***local_168;
  undefined8 local_160;
  run_configuration *local_f0;
  undefined4 local_e8;
  undefined1 ***local_e0;
  undefined8 **local_d8 [7];
  undefined1 ***local_a0;
  undefined8 local_98;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> local_48 [3];
  
  this = global_param_registry();
  param_registry::defaults(this);
  parameters::parameters((parameters *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  parameters::merged((parameters *)in_stack_fffffffffffffcd8,(parameters *)in_stack_fffffffffffffcd0
                    );
  parameters::~parameters((parameters *)0x2183f0);
  bVar1 = optional<nonius::run_configuration>::operator!
                    ((optional<nonius::run_configuration> *)(in_RSI + 0x38));
  if (bVar1) {
    local_e0 = (undefined1 ***)local_d8;
    parameters::parameters((parameters *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    local_a0 = (undefined1 ***)local_d8;
    local_98 = 1;
    std::allocator<nonius::parameters>::allocator((allocator<nonius::parameters> *)0x21846a);
    __l_00._M_len = (size_type)in_stack_fffffffffffffcf0;
    __l_00._M_array = in_stack_fffffffffffffce8;
    std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::vector
              ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
               in_stack_fffffffffffffce0,__l_00,(allocator_type *)in_stack_fffffffffffffcd8);
    std::allocator<nonius::parameters>::~allocator((allocator<nonius::parameters> *)0x21849e);
    local_288 = &local_a0;
    do {
      local_288 = local_288 + -7;
      parameters::~parameters((parameters *)0x2184d3);
    } while (local_288 != local_d8);
    local_e8 = 1;
  }
  else {
    prVar2 = optional<nonius::run_configuration>::operator*
                       ((optional<nonius::run_configuration> *)0x218634);
    local_f0 = prVar2;
    param::param((param *)in_stack_fffffffffffffcb0,(param *)in_stack_fffffffffffffca8);
    local_1f5._5_8_ = local_1e8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>
    ::pair<const_char_(&)[2],_std::plus<nonius::param>,_true>
              (in_stack_fffffffffffffce0,(char (*) [2])in_stack_fffffffffffffcd8,
               (plus<nonius::param> *)in_stack_fffffffffffffcd0);
    local_1f5._5_8_ = local_1a8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>
    ::pair<const_char_(&)[2],_std::multiplies<nonius::param>,_true>
              (in_stack_fffffffffffffce0,(char (*) [2])in_stack_fffffffffffffcd8,
               in_stack_fffffffffffffcd0);
    local_168 = (undefined1 ***)local_1e8;
    local_160 = 2;
    __k = (key_type *)local_1f5;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>
                 *)0x2186e4);
    __l._M_len = (size_type)in_stack_fffffffffffffce0;
    __l._M_array = in_stack_fffffffffffffcd8;
    pkVar5 = __k;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>_>
                     *)in_stack_fffffffffffffcd0,__l,in_stack_fffffffffffffcc8,
                    (hasher *)in_stack_fffffffffffffcc0,(key_equal *)in_stack_fffffffffffffcb8,
                    in_stack_fffffffffffffcf0);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>_>
             ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>_>
                   *)in_stack_fffffffffffffcb0,__k);
    std::function<nonius::param_(nonius::param,_nonius::param)>::function
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>_>
                      *)0x21876c);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>
                  *)0x218779);
    ppppuVar4 = &local_168;
    do {
      ppppuVar4 = ppppuVar4 + -8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>
      ::~pair(in_stack_fffffffffffffcb0);
    } while (ppppuVar4 != (undefined1 ****)local_1e8);
    local_1f6 = 0;
    (in_RDI->super__Vector_base<nonius::parameters,_std::allocator<nonius::parameters>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->super__Vector_base<nonius::parameters,_std::allocator<nonius::parameters>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (in_RDI->super__Vector_base<nonius::parameters,_std::allocator<nonius::parameters>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::vector
              ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)0x2187db);
    param::param((param *)in_stack_fffffffffffffcb0,(param *)__k);
    __first = std::back_inserter<std::vector<nonius::parameters,std::allocator<nonius::parameters>>>
                        ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)__k);
    local_218 = 1;
    local_210 = (vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)__first;
    std::max<unsigned_long>(&local_f0->count,&local_218);
    this_00 = local_48;
    __gen.oper = pmVar3;
    __gen.next = (param *)ppppuVar4;
    __gen.step = (param *)pkVar5;
    __gen.params = (parameters *)prVar2;
    __gen.run = in_stack_fffffffffffffd40;
    std::
    generate_n<std::back_insert_iterator<std::vector<nonius::parameters,std::allocator<nonius::parameters>>>,unsigned_long,nonius::generate_params(nonius::param_configuration)::_lambda()_1_>
              (__first,in_stack_fffffffffffffd00,__gen);
    local_1f6 = 1;
    local_e8 = 1;
    param::~param((param *)0x2188f4);
    if ((local_1f6 & 1) == 0) {
      std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::~vector(this_00);
    }
    std::function<nonius::param_(nonius::param,_nonius::param)>::~function
              ((function<nonius::param_(nonius::param,_nonius::param)> *)0x218a40);
    param::~param((param *)0x218a4d);
  }
  parameters::~parameters((parameters *)0x218a6b);
  return in_RDI;
}

Assistant:

inline std::vector<parameters> generate_params(param_configuration cfg) {
        auto params = global_param_registry().defaults().merged(cfg.map);
        if (!cfg.run) {
            return {params};
        } else {
            using operation_t = std::function<param(param, param)>;

            auto&& run = *cfg.run;
            auto step = run.step;
            auto oper = std::unordered_map<std::string, operation_t> {
                {"+", std::plus<param>{}},
                {"*", std::multiplies<param>{}},
            }.at(run.op);

            auto r = std::vector<parameters>{};
            auto next = run.init;
            std::generate_n(std::back_inserter(r), std::max(run.count, std::size_t{1}), [&] {
                auto last = next;
                next = oper(next, step);
                return params.merged(parameters{{run.name, last}});
            });

            return r;
        }
    }